

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausSimInfoRealloc(Clu_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (p->nCexes != p->nCexesAlloc) {
    __assert_fail("p->nCexes == p->nCexesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0x3f3,"void Fra_ClausSimInfoRealloc(Clu_Man_t *)");
  }
  pVVar2 = p->vCexes;
  lVar9 = (long)pVVar2->nSize;
  if (lVar9 < 2) {
    __assert_fail("Vec_PtrSize(vInfo) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x434,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
  }
  iVar1 = (int)((ulong)((long)pVVar2->pArray[1] - (long)*pVVar2->pArray) >> 2);
  lVar8 = (long)(iVar1 * 2);
  ppvVar4 = (void **)malloc((lVar8 * 4 + 8) * lVar9);
  lVar5 = lVar9 * 8;
  lVar6 = 0;
  do {
    ppvVar4[lVar6] = (void *)((long)ppvVar4 + lVar5);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + lVar8 * 4;
  } while (lVar9 != lVar6);
  lVar5 = 0;
  do {
    if (lVar9 == lVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    memcpy(ppvVar4[lVar5],pVVar2->pArray[lVar5],(long)(iVar1 << 2));
    lVar5 = lVar5 + 1;
  } while (lVar5 < pVVar2->nSize);
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  pVVar2->pArray = ppvVar4;
  pVVar2 = p->vCexes;
  if (0 < pVVar2->nSize) {
    iVar1 = p->nCexesAlloc;
    iVar7 = iVar1 + 0x1f;
    iVar3 = iVar1 + 0xf;
    if (-1 < iVar1) {
      iVar7 = iVar1;
      iVar3 = iVar1;
    }
    lVar9 = 0;
    do {
      memset((void *)((long)pVVar2->pArray[lVar9] + (long)((iVar7 >> 5) * 4)),0,
             (long)(((iVar3 >> 4) - (iVar7 >> 5)) * 4));
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar2->nSize);
  }
  p->nCexesAlloc = p->nCexesAlloc << 1;
  return;
}

Assistant:

void Fra_ClausSimInfoRealloc( Clu_Man_t * p )
{
    assert( p->nCexes == p->nCexesAlloc );
    Vec_PtrReallocSimInfo( p->vCexes );
    Vec_PtrCleanSimInfo( p->vCexes, p->nCexesAlloc/32, 2 * p->nCexesAlloc/32 );
    p->nCexesAlloc *= 2;
}